

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::Subst_Backward
          (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *this,
          TPZFMatrix<float> *b)

{
  long in_RDI;
  DecomposeType dec;
  DecomposeType in_stack_00002324;
  TPZFMatrix<float> *in_stack_00002328;
  TPZFileEqnStorage<float> *in_stack_00002330;
  
  std::operator<<((ostream *)&std::cout,"Entering Backward Substitution\n");
  std::ostream::flush();
  TPZFront<float>::GetDecomposeType((TPZFront<float> *)(in_RDI + 0xd8));
  TPZFileEqnStorage<float>::Backward(in_stack_00002330,in_stack_00002328,in_stack_00002324);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Backward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Backward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Backward(*b, dec);
	return 1;
}